

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O2

vector<int,_false,_6> __thiscall
immutable::vector<int,_false,_6>::insert
          (vector<int,_false,_6> *this,size_type_conflict pos,vector<int,_false,_6> *value)

{
  vector<int,_false,_6> *in_RCX;
  vector<int,_false,_6> local_40;
  vector<int,_false,_6> local_38;
  vector<int,_false,_6> local_30;
  
  take(&local_30,pos);
  operator+((immutable *)&local_38,&local_30,in_RCX);
  drop(&local_40,pos);
  operator+((immutable *)this,&local_38,&local_40);
  ref<immutable::rrb<int,_false,_6>_>::~ref(&local_40._impl);
  ref<immutable::rrb<int,_false,_6>_>::~ref(&local_38._impl);
  ref<immutable::rrb<int,_false,_6>_>::~ref(&local_30._impl);
  return (vector<int,_false,_6>)(ref<immutable::rrb<int,_false,_6>_>)this;
}

Assistant:

vector insert(size_type pos, vector value) const
        {
        return take(pos) + std::move(value) + drop(pos);
        }